

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O1

void __thiscall SynthWidget::setEmuModeText(SynthWidget *this)

{
  QLabel *pQVar1;
  QArrayData *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ROMInfo *pRVar5;
  storage_type *psVar6;
  char *__s;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QString t;
  QString emuMode;
  ROMImage *controlROMImage;
  ROMImage *pcmROMImage;
  QArrayData *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  ROMImage *local_20;
  ROMImage *local_18;
  
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  local_20 = (ROMImage *)0x0;
  local_18 = (ROMImage *)0x0;
  SynthRoute::getROMImages(this->synthRoute,&local_20,&local_18);
  if (local_20 == (ROMImage *)0x0) {
    __s = "Unknown";
  }
  else {
    pRVar5 = MT32Emu::ROMImage::getROMInfo(local_20);
    __s = pRVar5->description;
  }
  if (__s == (char *)0x0) {
    psVar6 = (storage_type *)0x0;
  }
  else {
    psVar6 = (storage_type *)strlen(__s);
  }
  QVar7.m_data = psVar6;
  QVar7.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar7);
  uVar4 = local_28;
  uVar3 = uStack_30;
  pQVar2 = local_38;
  local_38 = local_50;
  local_50 = pQVar2;
  uStack_30 = local_48;
  local_28 = uStack_40;
  local_48 = uVar3;
  uStack_40 = uVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,8);
    }
  }
  pQVar1 = (this->ui->super_Ui_SynthWidget).synthEmuModeLabel;
  QVar8.m_data = (storage_type *)0x10;
  QVar8.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar8);
  QString::append((QString *)&local_50);
  QLabel::setText((QString *)pQVar1);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,8);
    }
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  return;
}

Assistant:

void SynthWidget::setEmuModeText() {
	QString emuMode;
	const MT32Emu::ROMImage *controlROMImage = NULL;
	const MT32Emu::ROMImage *pcmROMImage = NULL;
	synthRoute->getROMImages(controlROMImage, pcmROMImage);
	emuMode = controlROMImage == NULL ? "Unknown" : controlROMImage->getROMInfo()->description;
	ui->synthEmuModeLabel->setText("Emulation Mode: " + emuMode);
}